

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::OneHotEncoder::MergePartialFromCodedStream
          (OneHotEncoder *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  short extraout_AX;
  uint32 uVar5;
  uint uVar6;
  Int64Vector *pIVar7;
  StringVector *pSVar8;
  pair<int,_int> pVar9;
  int iVar10;
  int iVar11;
  char cVar12;
  uint tag;
  ulong uVar13;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00251452;
      input->buffer_ = pbVar2 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00251452:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar13 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar5 | uVar13;
    }
    tag = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto LAB_00251474;
    uVar6 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar13;
    if (uVar6 < 10) {
      if (uVar6 == 1) {
        if (cVar12 != '\n') goto LAB_00251474;
        if (this->_oneof_case_[0] != 1) {
          clear_CategoryType(this);
          this->_oneof_case_[0] = 1;
          pSVar8 = (StringVector *)operator_new(0x30);
          StringVector::StringVector(pSVar8);
          (this->CategoryType_).stringcategories_ = pSVar8;
        }
        pSVar8 = (this->CategoryType_).stringcategories_;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar10 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
          input->buffer_ = puVar3 + 1;
          bVar4 = true;
        }
        else {
          iVar10 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar4 = -1 < iVar10;
        }
        iVar11 = 6;
        if ((bVar4) &&
           (pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar10), -1 < (long)pVar9)) {
          bVar4 = StringVector::MergePartialFromCodedStream(pSVar8,input);
          goto LAB_0025167b;
        }
      }
      else if ((uVar6 == 2) && (cVar12 == '\x12')) {
        if (this->_oneof_case_[0] != 2) {
          clear_CategoryType(this);
          this->_oneof_case_[0] = 2;
          pIVar7 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(pIVar7);
          (this->CategoryType_).int64categories_ = pIVar7;
        }
        pIVar7 = (this->CategoryType_).int64categories_;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar10 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
          input->buffer_ = puVar3 + 1;
          bVar4 = true;
        }
        else {
          iVar10 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar4 = -1 < iVar10;
        }
        iVar11 = 6;
        if ((bVar4) &&
           (pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar10), -1 < (long)pVar9)) {
          bVar4 = Int64Vector::MergePartialFromCodedStream(pIVar7,input);
LAB_0025167b:
          iVar11 = 6;
          if ((bVar4 != false) &&
             (bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                (input,pVar9.first), bVar4)) goto LAB_002514a3;
        }
      }
      else {
LAB_00251474:
        iVar11 = 7;
        if ((tag & 7) != 4 && tag != 0) {
          bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
          if (bVar4) goto LAB_002514a3;
          iVar11 = 6;
        }
      }
    }
    else {
      if (uVar6 == 0xb) {
        if (cVar12 != 'X') goto LAB_00251474;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar13 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002516a7;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_002516a7:
          uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar13;
        }
        if (!bVar4) {
          iVar11 = 6;
          goto LAB_002514a6;
        }
        this->handleunknown_ = (int)uVar13;
      }
      else {
        if ((uVar6 != 10) || (MergePartialFromCodedStream(), extraout_AX == 0)) goto LAB_00251474;
        iVar11 = 6;
        if (extraout_AX == 1) goto LAB_002514a6;
      }
LAB_002514a3:
      iVar11 = 0;
    }
LAB_002514a6:
    if (iVar11 != 0) {
      return iVar11 != 6;
    }
  } while( true );
}

Assistant:

bool OneHotEncoder::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.OneHotEncoder)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.StringVector stringCategories = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringcategories()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64Categories = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64categories()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool outputSparse = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &outputsparse_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_handleunknown(static_cast< ::CoreML::Specification::OneHotEncoder_HandleUnknown >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.OneHotEncoder)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.OneHotEncoder)
  return false;
#undef DO_
}